

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O0

void __thiscall sptk::reaper::FdFilter::MakeLinearFir(FdFilter *this,float fc,int *nf,float *coef)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *in_RDX;
  int *in_RSI;
  float in_XMM0_Da;
  double dVar4;
  double c;
  double fn;
  double twopi;
  int n;
  int i;
  int local_24;
  
  if (*in_RSI % 2 != 1) {
    *in_RSI = *in_RSI + 1;
  }
  iVar2 = (*in_RSI + 1) / 2;
  *in_RDX = in_XMM0_Da * 2.0;
  for (local_24 = 1; local_24 < iVar2; local_24 = local_24 + 1) {
    dVar4 = sin((double)local_24 * (double)in_XMM0_Da * 6.283185307179586);
    in_RDX[local_24] = (float)(dVar4 / ((double)local_24 * 3.141592653589793));
  }
  iVar1 = *in_RSI;
  for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
    dVar4 = cos((6.283185307179586 / (double)iVar1) * ((double)local_24 + 0.5));
    iVar3 = (iVar2 - local_24) + -1;
    in_RDX[iVar3] = (float)((double)in_RDX[iVar3] * (dVar4 * -0.5 + 0.5));
  }
  return;
}

Assistant:

void FdFilter::MakeLinearFir(float fc, int *nf, float *coef) {
  int i, n;
  double twopi, fn, c;

  if (((*nf % 2) != 1))
    *nf = *nf + 1;
  n = (*nf + 1) / 2;

  /*  Compute part of the ideal impulse response (the sin(x)/x kernel). */
  twopi = M_PI * 2.0;
  coef[0] = 2.0 * fc;
  c = M_PI;
  fn = twopi * fc;
  for (i = 1; i < n; i++)
    coef[i] = sin(i * fn) / (c * i);

  /* Now apply a Hanning window to the (infinite) impulse response. */
  /* (Could use other windows, like Kaiser, Gaussian...) */
  fn = twopi / *nf;
  for (i = 0; i < n; i++)
    coef[n - i - 1] *= (.5 - (.5 * cos(fn * (i + 0.5))));
}